

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMAttrNSImpl::setName(DOMAttrNSImpl *this,XMLCh *namespaceURI,XMLCh *qualifiedName)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  DOMDocument *pDVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  XMLCh *pXVar8;
  XMLCh *pXVar9;
  ulong uVar10;
  undefined4 extraout_var;
  XMLCh *pXVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMException *this_00;
  undefined4 extraout_var_02;
  undefined8 *puVar13;
  undefined4 extraout_var_03;
  long lVar14;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ulong uVar15;
  XMLSize_t XVar16;
  int colon_count;
  DOMStringPoolEntry *pDVar17;
  XMLCh *pXVar18;
  XMLCh XVar19;
  DOMDocumentImpl *this_01;
  XMLSize_t XVar20;
  bool bVar21;
  DOMStringPoolEntry *pDVar11;
  
  pDVar4 = (this->super_DOMAttrImpl).fParent.fOwnerDocument;
  this_01 = (DOMDocumentImpl *)&pDVar4[-1].super_DOMNode;
  if (pDVar4 == (DOMDocument *)0x0) {
    this_01 = (DOMDocumentImpl *)0x0;
  }
  pXVar8 = DOMNodeImpl::getXmlnsString();
  pXVar9 = DOMNodeImpl::getXmlnsURIString();
  iVar7 = 0;
  if (qualifiedName == (XMLCh *)0x0) {
    pXVar18 = (XMLCh *)0x0;
  }
  else {
    lVar14 = 0;
    do {
      psVar1 = (short *)((long)qualifiedName + lVar14);
      lVar14 = lVar14 + 2;
    } while (*psVar1 != 0);
    uVar10 = (ulong)(ushort)*qualifiedName;
    if (uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      XVar19 = qualifiedName[1];
      if (XVar19 != L'\0') {
        pXVar18 = qualifiedName + 2;
        do {
          uVar10 = (ulong)(ushort)XVar19 + (uVar10 >> 0x18) + uVar10 * 0x26;
          XVar19 = *pXVar18;
          pXVar18 = pXVar18 + 1;
        } while (XVar19 != L'\0');
      }
      uVar10 = uVar10 % this_01->fNameTableSize;
    }
    XVar20 = (lVar14 >> 1) - 1;
    pDVar11 = this_01->fNameTable[uVar10];
    if (pDVar11 == (DOMStringPoolEntry *)0x0) {
      pDVar17 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar10);
    }
    else {
      do {
        pDVar17 = pDVar11;
        if (pDVar17->fLength == XVar20) {
          pXVar18 = pDVar17->fString;
          if (pXVar18 == qualifiedName) goto LAB_002643b7;
          lVar14 = 0;
          do {
            psVar1 = (short *)((long)pXVar18 + lVar14);
            if (*psVar1 == 0) {
              if (*(short *)((long)qualifiedName + lVar14) == 0) goto LAB_002643b7;
              break;
            }
            psVar2 = (short *)((long)qualifiedName + lVar14);
            lVar14 = lVar14 + 2;
          } while (*psVar1 == *psVar2);
        }
        pDVar11 = pDVar17->fNext;
      } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
    }
    iVar6 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this_01,XVar20 * 2 + 0x18);
    pDVar11 = (DOMStringPoolEntry *)CONCAT44(extraout_var,iVar6);
    pDVar17->fNext = pDVar11;
    pDVar11->fLength = XVar20;
    pDVar11->fNext = (DOMStringPoolEntry *)0x0;
    pXVar18 = pDVar11->fString;
    XMLString::copyString(pXVar18,qualifiedName);
  }
LAB_002643b7:
  (this->super_DOMAttrImpl).fName = pXVar18;
  uVar10 = 0xffffffff;
  uVar15 = 0;
  do {
    if (qualifiedName[uVar15] == L':') {
      iVar7 = iVar7 + 1;
      uVar10 = uVar15 & 0xffffffff;
    }
    else if (qualifiedName[uVar15] == L'\0') break;
    uVar15 = uVar15 + 1;
  } while( true );
  iVar6 = (int)uVar10;
  XVar20 = 0xffffffff;
  if (((iVar6 != 0 && (int)uVar15 != 0) && (iVar7 < 2 && (int)uVar15 + -1 != iVar6)) &&
     (XVar20 = 0, iVar6 != -1)) {
    XVar20 = uVar10;
  }
  if ((int)XVar20 < 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_05,iVar7) == 0) {
      puVar13 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
      puVar13 = (undefined8 *)(CONCAT44(extraout_var_08,iVar7) + 0x158);
    }
    DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar13);
    goto LAB_00264981;
  }
  if ((int)XVar20 == 0) {
    bVar5 = true;
    if (pXVar18 != pXVar8) {
      if ((pXVar8 == (XMLCh *)0x0) || (pXVar12 = pXVar18, pXVar18 == (XMLCh *)0x0)) {
        if (pXVar18 == (XMLCh *)0x0) {
          if (pXVar8 != (XMLCh *)0x0) goto LAB_002646d0;
        }
        else {
          bVar5 = *pXVar18 == L'\0';
          if ((pXVar8 != (XMLCh *)0x0) && (*pXVar18 == L'\0')) {
LAB_002646d0:
            bVar5 = *pXVar8 == L'\0';
          }
        }
      }
      else {
        do {
          XVar19 = *pXVar12;
          if (XVar19 == L'\0') goto LAB_002646d0;
          XVar3 = *pXVar8;
          pXVar12 = pXVar12 + 1;
          pXVar8 = pXVar8 + 1;
        } while (XVar19 == XVar3);
        bVar5 = false;
      }
    }
    if (bVar5) {
      if (pXVar9 != namespaceURI) {
        pXVar8 = pXVar9;
        pXVar12 = namespaceURI;
        if (pXVar9 == (XMLCh *)0x0 || namespaceURI == (XMLCh *)0x0) {
          if (namespaceURI == (XMLCh *)0x0) {
            if (pXVar9 == (XMLCh *)0x0) goto LAB_002647a6;
LAB_0026479b:
            bVar21 = *pXVar8 == L'\0';
          }
          else {
            bVar21 = *namespaceURI == L'\0';
            if (bVar21 && pXVar9 != (XMLCh *)0x0) goto LAB_0026479b;
          }
          if (bVar21) goto LAB_002647a6;
        }
        else {
          do {
            XVar19 = *pXVar12;
            if (XVar19 == L'\0') goto LAB_0026479b;
            XVar3 = *pXVar8;
            pXVar8 = pXVar8 + 1;
            pXVar12 = pXVar12 + 1;
          } while (XVar19 == XVar3);
        }
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
        if (CONCAT44(extraout_var_03,iVar7) == 0) {
          puVar13 = &XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
          puVar13 = (undefined8 *)(CONCAT44(extraout_var_06,iVar7) + 0x158);
        }
        DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar13);
LAB_00264981:
        __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
      }
LAB_002647a6:
      this->fPrefix = (XMLCh *)0x0;
      this->fLocalName = pXVar18;
      if (bVar5) goto LAB_002647e6;
    }
    else {
      this->fPrefix = (XMLCh *)0x0;
      this->fLocalName = pXVar18;
    }
  }
  else {
    if (pXVar18 == (XMLCh *)0x0) {
      pXVar8 = (XMLCh *)0x0;
    }
    else {
      uVar10 = (ulong)(ushort)*pXVar18;
      XVar16 = 0;
      do {
        uVar10 = (ulong)(ushort)pXVar18[XVar16 + 1] + (uVar10 >> 0x18) + uVar10 * 0x26;
        XVar16 = XVar16 + 1;
      } while (XVar20 != XVar16);
      uVar10 = uVar10 % this_01->fNameTableSize;
      pDVar11 = this_01->fNameTable[uVar10];
      if (pDVar11 == (DOMStringPoolEntry *)0x0) {
        pDVar17 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar10);
      }
      else {
        do {
          pDVar17 = pDVar11;
          if (pDVar17->fLength == XVar20) {
            pXVar8 = pDVar17->fString;
            if (pXVar8 == pXVar18) goto LAB_00264555;
            XVar16 = 0;
            while ((XVar19 = pXVar8[XVar16], XVar19 != L'\0' && (XVar19 == pXVar18[XVar16]))) {
              XVar16 = XVar16 + 1;
              if (XVar20 == XVar16) goto LAB_00264555;
            }
            if (XVar19 == pXVar18[XVar16]) goto LAB_00264555;
          }
          pDVar11 = pDVar17->fNext;
        } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
      }
      iVar7 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                        (this_01,XVar20 * 2 + 0x18);
      pDVar11 = (DOMStringPoolEntry *)CONCAT44(extraout_var_00,iVar7);
      pDVar17->fNext = pDVar11;
      pDVar11->fLength = XVar20;
      pDVar11->fNext = (DOMStringPoolEntry *)0x0;
      pXVar8 = pDVar11->fString;
      XMLString::copyNString(pXVar8,pXVar18,XVar20);
    }
LAB_00264555:
    this->fPrefix = pXVar8;
    pXVar8 = (this->super_DOMAttrImpl).fName;
    pXVar9 = pXVar8 + XVar20 + 1;
    lVar14 = 0;
    do {
      psVar1 = (short *)((long)pXVar9 + lVar14);
      lVar14 = lVar14 + 2;
    } while (*psVar1 != 0);
    uVar10 = (ulong)(ushort)*pXVar9;
    if (uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      XVar19 = pXVar8[XVar20 + 2];
      if (XVar19 != L'\0') {
        pXVar8 = pXVar8 + XVar20 + 3;
        do {
          uVar10 = (ulong)(ushort)XVar19 + (uVar10 >> 0x18) + uVar10 * 0x26;
          XVar19 = *pXVar8;
          pXVar8 = pXVar8 + 1;
        } while (XVar19 != L'\0');
      }
      uVar10 = uVar10 % this_01->fNameTableSize;
    }
    XVar20 = (lVar14 >> 1) - 1;
    pDVar11 = this_01->fNameTable[uVar10];
    if (pDVar11 == (DOMStringPoolEntry *)0x0) {
      pDVar17 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar10);
    }
    else {
      do {
        pDVar17 = pDVar11;
        if (pDVar17->fLength == XVar20) {
          pXVar8 = pDVar17->fString;
          if (pXVar8 == pXVar9) goto LAB_0026465b;
          lVar14 = 0;
          do {
            psVar1 = (short *)((long)pXVar8 + lVar14);
            if (*psVar1 == 0) {
              if (*(short *)((long)pXVar9 + lVar14) == 0) goto LAB_0026465b;
              break;
            }
            psVar2 = (short *)((long)pXVar9 + lVar14);
            lVar14 = lVar14 + 2;
          } while (*psVar1 == *psVar2);
        }
        pDVar11 = pDVar17->fNext;
      } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
    }
    iVar7 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this_01,XVar20 * 2 + 0x18);
    pDVar11 = (DOMStringPoolEntry *)CONCAT44(extraout_var_01,iVar7);
    pDVar17->fNext = pDVar11;
    pDVar11->fLength = XVar20;
    pDVar11->fNext = (DOMStringPoolEntry *)0x0;
    pXVar8 = pDVar11->fString;
    XMLString::copyString(pXVar8,pXVar9);
LAB_0026465b:
    this->fLocalName = pXVar8;
    bVar5 = DOMDocumentImpl::isXMLName(this_01,this->fPrefix);
    if ((!bVar5) || (bVar5 = DOMDocumentImpl::isXMLName(this_01,this->fLocalName), !bVar5)) {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])(this);
      if (CONCAT44(extraout_var_02,iVar7) == 0) {
        puVar13 = &XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar7 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
        puVar13 = (undefined8 *)(CONCAT44(extraout_var_07,iVar7) + 0x158);
      }
      DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar13);
      goto LAB_00264981;
    }
  }
  pXVar8 = (XMLCh *)0x0;
  if ((namespaceURI != (XMLCh *)0x0) && (*namespaceURI != L'\0')) {
    pXVar8 = namespaceURI;
  }
  pXVar9 = DOMNodeImpl::mapPrefix(this->fPrefix,pXVar8,2);
LAB_002647e6:
  if (pXVar9 == (XMLCh *)0x0) {
    pXVar8 = (XMLCh *)0x0;
  }
  else {
    lVar14 = 0;
    do {
      psVar1 = (short *)((long)pXVar9 + lVar14);
      lVar14 = lVar14 + 2;
    } while (*psVar1 != 0);
    uVar10 = (ulong)(ushort)*pXVar9;
    if (uVar10 == 0) {
      uVar10 = 0;
    }
    else {
      XVar19 = pXVar9[1];
      if (XVar19 != L'\0') {
        pXVar8 = pXVar9 + 2;
        do {
          uVar10 = (ulong)(ushort)XVar19 + (uVar10 >> 0x18) + uVar10 * 0x26;
          XVar19 = *pXVar8;
          pXVar8 = pXVar8 + 1;
        } while (XVar19 != L'\0');
      }
      uVar10 = uVar10 % this_01->fNameTableSize;
    }
    XVar20 = (lVar14 >> 1) - 1;
    pDVar11 = this_01->fNameTable[uVar10];
    if (pDVar11 == (DOMStringPoolEntry *)0x0) {
      pDVar17 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar10);
    }
    else {
      do {
        pDVar17 = pDVar11;
        if (pDVar17->fLength == XVar20) {
          pXVar8 = pDVar17->fString;
          if (pXVar8 == pXVar9) goto LAB_002648dc;
          lVar14 = 0;
          do {
            psVar1 = (short *)((long)pXVar8 + lVar14);
            if (*psVar1 == 0) {
              if (*(short *)((long)pXVar9 + lVar14) == 0) goto LAB_002648dc;
              break;
            }
            psVar2 = (short *)((long)pXVar9 + lVar14);
            lVar14 = lVar14 + 2;
          } while (*psVar1 == *psVar2);
        }
        pDVar11 = pDVar17->fNext;
      } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
    }
    iVar7 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this_01,XVar20 * 2 + 0x18);
    pDVar11 = (DOMStringPoolEntry *)CONCAT44(extraout_var_04,iVar7);
    pDVar17->fNext = pDVar11;
    pDVar11->fLength = XVar20;
    pDVar11->fNext = (DOMStringPoolEntry *)0x0;
    pXVar8 = pDVar11->fString;
    XMLString::copyString(pXVar8,pXVar9);
  }
LAB_002648dc:
  this->fNamespaceURI = pXVar8;
  return;
}

Assistant:

void DOMAttrNSImpl::setName(const XMLCh* namespaceURI, const XMLCh* qualifiedName)
{
    DOMDocumentImpl* ownerDoc = (DOMDocumentImpl *)fParent.fOwnerDocument;
    const XMLCh * xmlns = DOMNodeImpl::getXmlnsString();
    const XMLCh * xmlnsURI = DOMNodeImpl::getXmlnsURIString();
    this->fName = ownerDoc->getPooledString(qualifiedName);

    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    bool xmlnsAlone = false;	//true if attribute name is "xmlns"
    if (index == 0)
    {	//qualifiedName contains no ':'
        if (XMLString::equals(this->fName, xmlns)) {
            if (!XMLString::equals(namespaceURI, xmlnsURI))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
            xmlnsAlone = true;
        }
        fPrefix = 0;
        fLocalName = fName;
    }
    else
    {
        fPrefix = ownerDoc->getPooledNString(fName, index);
        fLocalName = ownerDoc->getPooledString(fName+index+1);

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (!ownerDoc->isXMLName(fPrefix) || !ownerDoc->isXMLName(fLocalName))
            throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    // DOM Level 3: namespace URI is never empty string.
    const XMLCh * URI = xmlnsAlone ? xmlnsURI
        : DOMNodeImpl::mapPrefix
          (
              fPrefix,
              (!namespaceURI || !*namespaceURI) ? 0 : namespaceURI,
              DOMNode::ATTRIBUTE_NODE
          );
    this -> fNamespaceURI = (URI == 0) ? 0 : ownerDoc->getPooledString(URI);
}